

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,DenseMatrix *wordVectors)

{
  int32_t iVar1;
  element_type *this_00;
  FastText *in_RSI;
  DenseMatrix *in_RDI;
  undefined1 auVar2 [16];
  real norm;
  string word;
  int32_t i;
  Vector vec;
  int64_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa8;
  real in_stack_ffffffffffffffac;
  Vector *in_stack_ffffffffffffffb0;
  int local_30;
  string *in_stack_ffffffffffffffe0;
  Vector *in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19bcad);
  Vector::Vector((Vector *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
  DenseMatrix::zero(in_RDI);
  local_30 = 0;
  while( true ) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x19bce8);
    iVar1 = Dictionary::nwords(this_00);
    if (iVar1 <= local_30) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x19bd14);
    Dictionary::getWord_abi_cxx11_
              ((Dictionary *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (int32_t)((ulong)in_RDI >> 0x20));
    getWordVector(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffac = Vector::norm(in_stack_ffffffffffffffb0);
    if (0.0 < in_stack_ffffffffffffffac) {
      auVar2._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
      auVar2._0_4_ = 1.0 / in_stack_ffffffffffffffac;
      (*(code *)(((in_RSI->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->manualArgs_)._M_h._M_element_count)
                (auVar2._0_8_,in_RSI,&stack0xffffffffffffffe0,(long)local_30);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    local_30 = local_30 + 1;
  }
  Vector::~Vector((Vector *)0x19bdef);
  return;
}

Assistant:

void FastText::precomputeWordVectors(DenseMatrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addVectorToRow(vec, i, 1.0 / norm);
    }
  }
}